

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

void test_regular_announcement(rtr_socket *socket)

{
  int iVar1;
  uint32_t sn;
  uint16_t in_SI;
  uint16_t session_id;
  size_t in_R8;
  long in_FS_OFFSET;
  aspa_record _records345 [1];
  update_callback _callbacks340 [1];
  uint32_t local_88 [4];
  aspa_record local_78;
  uint32_t local_58 [4];
  update_callback local_48;
  undefined8 local_20;
  undefined8 uStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response((uint8_t)socket,in_SI);
  local_20 = 0x44e0000044d;
  uStack_18 = 0x4500000044f;
  session_id = 0x44c;
  append_aspa('\x01','L',(uint32_t)&local_20,(uint32_t *)0x4,in_R8);
  end_cache_response(0xb5,session_id,sn);
  expected_callbacks = &local_48;
  local_48.source = (aspa_table *)0x0;
  local_48.record.customer_asn = 0x44c;
  local_48.record.provider_count = 4;
  local_48.record.provider_asns = local_58;
  local_58[0] = 0x44d;
  local_58[1] = 0x44e;
  local_58[2] = 0x44f;
  local_58[3] = 0x450;
  local_48.type = ASPA_ADD;
  callback_count = 1;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x156,"void test_regular_announcement(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_78.customer_asn = 0x44c;
    local_78.provider_count = 4;
    local_88[0] = 0x44d;
    local_88[1] = 0x44e;
    local_88[2] = 0x44f;
    local_88[3] = 0x450;
    local_78.provider_asns = local_88;
    assert_table(socket,&local_78,1);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x157,"void test_regular_announcement(struct rtr_socket *)");
}

Assistant:

static void test_regular_announcement(struct rtr_socket *socket)
{
	// Test: regular announcement
	// Expect: OK
	// DB: inserted
	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket, RECORD(1100, ASNS(1101, 1102, 1103, 1104)));
}